

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O1

phits_file_t phits_open_file(char *filename)

{
  int iVar1;
  phits_fileinternal_t *f;
  FILE *pFVar2;
  char *pcVar3;
  int iVar4;
  
  if (filename == (char *)0x0) {
    pFVar2 = (FILE *)phits_impl_stdout_data::thefh;
    if (phits_impl_stdout_data::thefh == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"ERROR: %s\n","phits_open_file called with null string for filename");
    exit(1);
  }
  f = (phits_fileinternal_t *)calloc(1,0x110);
  if (f != (phits_fileinternal_t *)0x0) {
    f->lbuf = 0;
    f->haspolarisation = 0;
    f->reclen = 4;
    f->particlesize = 0;
    (f->part).x = 0.0;
    (f->part).y = 0.0;
    (f->part).z = 0.0;
    (f->part).dirx = 0.0;
    (f->part).diry = 0.0;
    (f->part).dirz = 0.0;
    (f->part).polx = 0.0;
    (f->part).poly = 0.0;
    (f->part).polz = 0.0;
    (f->part).weight = 0.0;
    (f->part).ekin = 0.0;
    (f->part).time = 0.0;
    (f->part).rawtype = 0;
    (f->part).pdgcode = 0;
    mcpl_generic_fopen(f,filename);
    iVar4 = 1 - f->lbuf;
    if (0 < iVar4) {
      iVar1 = mcpl_generic_fread_try(f,f->buf + f->lbuf,iVar4);
      if (iVar1 != iVar4) {
        f->particlesize = 0;
        iVar4 = 0;
        goto LAB_001027f2;
      }
      f->lbuf = 1;
    }
    iVar4 = phits_tryload_reclen(f,4);
    if (iVar4 == 0) {
      iVar4 = phits_tryload_reclen(f,8);
      if (iVar4 == 0) {
        pFVar2 = (FILE *)phits_impl_stdout_data::thefh;
        if (phits_impl_stdout_data::thefh == (FILE *)0x0) {
          pFVar2 = _stdout;
        }
        if (f->lbuf < 8) {
          pcVar3 = "Invalid PHITS dump file: too short\n";
        }
        else {
          pcVar3 = "Invalid PHITS dump file: Problems reading first record.\n";
        }
        goto LAB_00102884;
      }
    }
    if (f->reclen == 8) {
      pFVar2 = (FILE *)phits_impl_stdout_data::thefh;
      if (phits_impl_stdout_data::thefh == (FILE *)0x0) {
        pFVar2 = _stdout;
      }
      fwrite("phits_open_file WARNING: 64bit Fortran records detected which is untested (feedback appreciated at https://mctools.github.io/mcpl/contact/).\n"
             ,0x8d,1,pFVar2);
    }
    iVar4 = 0;
    if (f->particlesize != 0x50) {
      if (f->particlesize != 0x68) {
        pFVar2 = (FILE *)phits_impl_stdout_data::thefh;
        if (phits_impl_stdout_data::thefh == (FILE *)0x0) {
          pFVar2 = _stdout;
        }
        pcVar3 = 
        "Invalid PHITS dump file: Does not contain exactly 10 or 13 fields in each particle - like due to unsupported configuration flags being used when producing the file.\n"
        ;
        goto LAB_00102884;
      }
      iVar4 = 1;
    }
LAB_001027f2:
    f->haspolarisation = iVar4;
    return (phits_file_t)f;
  }
  pFVar2 = (FILE *)phits_impl_stdout_data::thefh;
  if (phits_impl_stdout_data::thefh == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  pcVar3 = "memory allocation failure";
LAB_00102884:
  fprintf(pFVar2,"ERROR: %s\n",pcVar3);
  exit(1);
}

Assistant:

phits_file_t phits_open_file( const char * filename )
{
  if (!filename)
    phits_error("phits_open_file called with null string for filename");

  //Open, classify and process first record with mcnp type and version info:
  phits_file_t out = phits_open_internal( filename );
  phits_fileinternal_t * f = (phits_fileinternal_t *)out.internal;
  assert(f);

  out.internal = f;
  return out;
}